

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

_Bool fnet_socket_select(fnet_socket_t *sockets,size_t num,fnet_socket_t *rs,size_t *rs_num,
                        fnet_socket_t *es,size_t *es_num,size_t msec)

{
  uint uVar1;
  int iVar2;
  size_t i;
  size_t sVar3;
  long lVar4;
  fd_set *__exceptfds;
  size_t sVar5;
  size_t sVar6;
  fd_set *__readfds;
  uint uVar7;
  timeval *__timeout;
  timeval local_140;
  fd_set exceptfds;
  fd_set readfds;
  
  if (((num == 0 || sockets == (fnet_socket_t *)0x0) ||
      (rs == (fnet_socket_t *)0x0 && es == (fnet_socket_t *)0x0)) ||
     (rs != (fnet_socket_t *)0x0 && rs_num == (size_t *)0x0)) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    if (es == (fnet_socket_t *)0x0 || es_num != (size_t *)0x0) {
      for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
        if (uVar7 <= sockets[sVar3]) {
          uVar7 = sockets[sVar3];
        }
      }
      if (rs != (fnet_socket_t *)0x0) {
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          readfds.__fds_bits[lVar4] = 0;
        }
        for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
          readfds.__fds_bits[sockets[sVar3] >> 6] =
               readfds.__fds_bits[sockets[sVar3] >> 6] | 1L << ((byte)sockets[sVar3] & 0x3f);
        }
        *rs_num = 0;
      }
      if (es != (fnet_socket_t *)0x0) {
        for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
          exceptfds.__fds_bits[lVar4] = 0;
        }
        for (sVar3 = 0; num != sVar3; sVar3 = sVar3 + 1) {
          exceptfds.__fds_bits[sockets[sVar3] >> 6] =
               exceptfds.__fds_bits[sockets[sVar3] >> 6] | 1L << ((byte)sockets[sVar3] & 0x3f);
        }
        *es_num = 0;
      }
      if (msec == 0xffffffffffffffff) {
        __timeout = (timeval *)0x0;
      }
      else {
        local_140.tv_sec = msec / 1000;
        local_140.tv_usec = (msec % 1000) * 1000;
        __timeout = &local_140;
      }
      __readfds = &readfds;
      if (rs == (fnet_socket_t *)0x0) {
        __readfds = (fd_set *)0x0;
      }
      __exceptfds = &exceptfds;
      if (es == (fnet_socket_t *)0x0) {
        __exceptfds = (fd_set *)0x0;
      }
      iVar2 = select(uVar7 + 1,(fd_set *)__readfds,(fd_set *)0x0,(fd_set *)__exceptfds,__timeout);
      uVar7 = (uint)(-1 < iVar2);
      if (-1 < iVar2) {
        sVar5 = 0;
        sVar3 = 0;
        for (sVar6 = 0; num != sVar6; sVar6 = sVar6 + 1) {
          if ((rs != (fnet_socket_t *)0x0) &&
             (uVar1 = sockets[sVar6],
             ((ulong)readfds.__fds_bits[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
            rs[sVar5] = uVar1;
            sVar5 = sVar5 + 1;
          }
          if ((es != (fnet_socket_t *)0x0) &&
             (uVar1 = sockets[sVar6],
             ((ulong)exceptfds.__fds_bits[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0)) {
            es[sVar3] = uVar1;
            sVar3 = sVar3 + 1;
          }
        }
        if (rs_num != (size_t *)0x0) {
          *rs_num = sVar5;
        }
        if (es_num != (size_t *)0x0) {
          *es_num = sVar3;
        }
      }
    }
  }
  return SUB41(uVar7,0);
}

Assistant:

bool fnet_socket_select(fnet_socket_t *sockets,
                        size_t num,
                        fnet_socket_t *rs,
                        size_t *rs_num,
                        fnet_socket_t *es,
                        size_t *es_num,
                        size_t msec)
{
    if (!sockets || !num)   return false;
    if (!rs && !es)         return false;
    if (rs && !rs_num)      return false;
    if (es && !es_num)      return false;

    fd_set readfds;
    fd_set exceptfds;
    fnet_socket_t nfds = 0;

    for(size_t i = 0; i < num; ++i)
        nfds = nfds < sockets[i] ? sockets[i] : nfds;

    if (rs)
    {
        FD_ZERO(&readfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &readfds);
        *rs_num = 0;
    }

    if (es)
    {
        FD_ZERO(&exceptfds);
        for(size_t i = 0; i < num; ++i)
            FD_SET(sockets[i], &exceptfds);
        *es_num = 0;
    }

    struct timeval timeout;
    if (msec != (size_t)-1)
        timeout = msec2timeval(msec);

    int ret = select(nfds + 1, rs ? &readfds : 0, 0, es ? &exceptfds : 0, msec != (size_t)-1 ? &timeout : 0);
    if (ret < 0)
    {
        FLOG_ERR("Socket waiting was failed");
        return false;
    }

    size_t rsi = 0;
    size_t esi = 0;

    for(size_t i = 0; i < num; ++i)
    {
        if (rs && FD_ISSET(sockets[i], &readfds))
            rs[rsi++] = sockets[i];
        if (es && FD_ISSET(sockets[i], &exceptfds))
            es[esi++] = sockets[i];
    }

    if (rs_num) *rs_num = rsi;
    if (es_num) *es_num = esi;
    return true;
}